

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_pixel_format.cpp
# Opt level: O3

component_flags crnlib::pixel_format_helpers::get_component_flags(pixel_format fmt)

{
  if ((int)fmt < 0x41424752) {
    if (0x32545843 < (int)fmt) {
      if ((int)fmt < 0x35545844) {
        if (((fmt != PIXEL_FMT_DXT2) && (fmt != PIXEL_FMT_DXT3)) && (fmt != PIXEL_FMT_DXT4)) {
          return cCompFlagGrayscale|cDefaultCompFlags;
        }
        return cDefaultCompFlags;
      }
      if (fmt == PIXEL_FMT_DXT5) {
        return cDefaultCompFlags;
      }
      if (fmt != PIXEL_FMT_DXT1A) {
        if (fmt != PIXEL_FMT_ETC2A) {
          return cCompFlagGrayscale|cDefaultCompFlags;
        }
        return cDefaultCompFlags;
      }
      return cDefaultCompFlags;
    }
    if ((int)fmt < 0x31545844) {
      if (fmt != PIXEL_FMT_ETC1) {
        if (fmt != PIXEL_FMT_DXT5A) {
          return cCompFlagGrayscale|cDefaultCompFlags;
        }
        return cCompFlagAValid;
      }
    }
    else if ((fmt != PIXEL_FMT_DXT1) && (fmt != PIXEL_FMT_ETC2)) {
      if (fmt != PIXEL_FMT_3DC) {
        return cCompFlagGrayscale|cDefaultCompFlags;
      }
      return cCompFlagNormalMap|cCompFlagBValid|cCompFlagGValid|cCompFlagRValid;
    }
  }
  else {
    if ((int)fmt < 0x53315445) {
      if ((int)fmt < 0x52424741) {
        if (fmt == PIXEL_FMT_A8R8G8B8) {
          return cDefaultCompFlags;
        }
        if (fmt != PIXEL_FMT_A8) {
          return cCompFlagGrayscale|cDefaultCompFlags;
        }
        return cCompFlagAValid;
      }
      if (fmt == PIXEL_FMT_DXT5_AGBR) {
        return cCompFlagNormalMap|cDefaultCompFlags;
      }
      if ((fmt != PIXEL_FMT_DXT5_xGBR) && (fmt != PIXEL_FMT_DXT5_xGxR)) {
        return cCompFlagGrayscale|cDefaultCompFlags;
      }
      return cCompFlagNormalMap|cCompFlagBValid|cCompFlagGValid|cCompFlagRValid;
    }
    if ((int)fmt < 0x59784343) {
      if (fmt != PIXEL_FMT_ETC1S) {
        if (fmt == PIXEL_FMT_ETC2AS) {
          return cDefaultCompFlags;
        }
        if (fmt != PIXEL_FMT_DXN) {
          return cCompFlagGrayscale|cDefaultCompFlags;
        }
        return cCompFlagNormalMap|cCompFlagBValid|cCompFlagGValid|cCompFlagRValid;
      }
    }
    else {
      if (fmt == PIXEL_FMT_DXT5_CCxY) {
        return cCompFlagLumaChroma|cCompFlagBValid|cCompFlagGValid|cCompFlagRValid;
      }
      if (fmt != PIXEL_FMT_R8G8B8) {
        if (fmt != PIXEL_FMT_L8) {
          return cCompFlagGrayscale|cDefaultCompFlags;
        }
        return cCompFlagGrayscale|cCompFlagBValid|cCompFlagGValid|cCompFlagRValid;
      }
    }
  }
  return cCompFlagBValid|cCompFlagGValid|cCompFlagRValid;
}

Assistant:

component_flags get_component_flags(pixel_format fmt)
        {
            // These flags are for *uncooked* pixels, i.e. after after adding Z to DXN maps, or converting YCC maps to RGB, etc.

            uint flags = cCompFlagRValid | cCompFlagGValid | cCompFlagBValid | cCompFlagAValid | cCompFlagGrayscale;
            switch (fmt)
            {
            case PIXEL_FMT_DXT1:
            case PIXEL_FMT_ETC1:
            case PIXEL_FMT_ETC2:
            case PIXEL_FMT_ETC1S:
            {
                flags = cCompFlagRValid | cCompFlagGValid | cCompFlagBValid;
                break;
            }
            case PIXEL_FMT_DXT1A:
            {
                flags = cCompFlagRValid | cCompFlagGValid | cCompFlagBValid | cCompFlagAValid;
                break;
            }
            case PIXEL_FMT_DXT2:
            case PIXEL_FMT_DXT3:
            {
                flags = cCompFlagRValid | cCompFlagGValid | cCompFlagBValid | cCompFlagAValid;
                break;
            }
            case PIXEL_FMT_DXT4:
            case PIXEL_FMT_DXT5:
            case PIXEL_FMT_ETC2A:
            case PIXEL_FMT_ETC2AS:
            {
                flags = cCompFlagRValid | cCompFlagGValid | cCompFlagBValid | cCompFlagAValid;
                break;
            }
            case PIXEL_FMT_DXT5A:
            {
                flags = cCompFlagAValid;
                break;
            }
            case PIXEL_FMT_DXT5_CCxY:
            {
                flags = cCompFlagRValid | cCompFlagGValid | cCompFlagBValid | cCompFlagLumaChroma;
                break;
            }
            case PIXEL_FMT_DXT5_xGBR:
            {
                flags = cCompFlagRValid | cCompFlagGValid | cCompFlagBValid | cCompFlagNormalMap;
                break;
            }
            case PIXEL_FMT_DXT5_AGBR:
            {
                flags = cCompFlagRValid | cCompFlagGValid | cCompFlagBValid | cCompFlagAValid | cCompFlagNormalMap;
                break;
            }
            case PIXEL_FMT_DXT5_xGxR:
            {
                flags = cCompFlagRValid | cCompFlagGValid | cCompFlagBValid | cCompFlagNormalMap;
                break;
            }
            case PIXEL_FMT_3DC:
            {
                flags = cCompFlagRValid | cCompFlagGValid | cCompFlagBValid | cCompFlagNormalMap;
                break;
            }
            case PIXEL_FMT_DXN:
            {
                flags = cCompFlagRValid | cCompFlagGValid | cCompFlagBValid | cCompFlagNormalMap;
                break;
            }
            case PIXEL_FMT_R8G8B8:
            {
                flags = cCompFlagRValid | cCompFlagGValid | cCompFlagBValid;
                break;
            }
            case PIXEL_FMT_A8R8G8B8:
            {
                flags = cCompFlagRValid | cCompFlagGValid | cCompFlagBValid | cCompFlagAValid;
                break;
            }
            case PIXEL_FMT_A8:
            {
                flags = cCompFlagAValid;
                break;
            }
            case PIXEL_FMT_L8:
            {
                flags = cCompFlagRValid | cCompFlagGValid | cCompFlagBValid | cCompFlagGrayscale;
                break;
            }
            case PIXEL_FMT_A8L8:
            {
                flags = cCompFlagRValid | cCompFlagGValid | cCompFlagBValid | cCompFlagAValid | cCompFlagGrayscale;
                break;
            }
            default:
            {
                CRNLIB_ASSERT(0);
                break;
            }
            }
            return static_cast<component_flags>(flags);
        }